

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  undefined1 local_40 [8];
  TraceInfo trace;
  
  trace.line = 0;
  trace._12_4_ = 0;
  trace.message.c_str_ = (char *)0x0;
  local_40 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  StringStreamToString((internal *)&trace.message.length_,(message->ss_).ptr_);
  String::operator=((String *)&trace.line,(String *)&trace.message.length_);
  if (trace.message.length_ != 0) {
    operator_delete__((void *)trace.message.length_);
  }
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,(TraceInfo *)local_40);
  if (trace._8_8_ != 0) {
    operator_delete__((void *)trace._8_8_);
  }
  return;
}

Assistant:

ScopedTrace::ScopedTrace(const char* file, int line, const Message& message) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}